

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O3

void meixner(int n,double beta,double c,double x,double *v)

{
  ulong uVar1;
  char *pcVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  if (beta <= 0.0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"MEIXNER - Fatal error!\n");
    pcVar2 = "  Parameter BETA must be positive.\n";
  }
  else if ((c <= 0.0) || (1.0 <= c)) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"MEIXNER - Fatal error!\n");
    pcVar2 = "  Parameter C must be strictly between 0 and 1.\n";
  }
  else {
    if (-1 < n) {
      *v = 1.0;
      if (n != 0) {
        dVar3 = (c + -1.0) * x;
        dVar4 = (dVar3 / beta) / c + 1.0;
        v[1] = dVar4;
        if (n != 1) {
          uVar1 = 1;
          do {
            dVar5 = (double)(int)uVar1;
            dVar4 = (((c + 1.0) * dVar5 + dVar3 + beta * c) * dVar4 - v[uVar1 - 1] * dVar5) /
                    (dVar5 + beta);
            v[uVar1 + 1] = dVar4;
            uVar1 = uVar1 + 1;
          } while ((uint)n != uVar1);
        }
      }
      return;
    }
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"MEIXNER - Fatal error!\n");
    pcVar2 = "  Parameter N must be nonnegative.\n";
  }
  std::operator<<((ostream *)&std::cerr,pcVar2);
  exit(1);
}

Assistant:

BURKHARDT_EXPORT
void meixner ( int n, double beta, double c, double x, double v[] )

//****************************************************************************80
//
//  Purpose:
//
//    MEIXNER evaluates Meixner polynomials at a point.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 March 2009
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Walter Gautschi,
//    Orthogonal Polynomials: Computation and Approximation,
//    Oxford, 2004,
//    ISBN: 0-19-850672-4,
//    LC: QA404.5 G3555.
//
//  Parameters:
//
//    Input, int N, the maximum order of the polynomial.  
//    N must be at least 0.
//
//    Input, double BETA, the Beta parameter.  0 < BETA.
//
//    Input, double C, the C parameter.  0 < C < 1.
//
//    Input, double X, the evaluation point.
//
//    Output, double V[N+1], the value of the polynomials at X.
//
{
  int i;

  if ( beta <= 0.0 )
  {
    std::cerr << "\n";
    std::cerr << "MEIXNER - Fatal error!\n";
    std::cerr << "  Parameter BETA must be positive.\n";
    exit ( 1 );
  }

  if ( c <= 0.0 || 1.0 <= c )
  {
    std::cerr << "\n";
    std::cerr << "MEIXNER - Fatal error!\n";
    std::cerr << "  Parameter C must be strictly between 0 and 1.\n";
    exit ( 1 );
  }

  if ( n < 0 )
  {
    std::cerr << "\n";
    std::cerr << "MEIXNER - Fatal error!\n";
    std::cerr << "  Parameter N must be nonnegative.\n";
    exit ( 1 );
  }

  v[0] = 1.0;

  if ( n == 0 )
  {
    return;
  }

  v[1] = ( c - 1.0 ) * x / beta / c + 1.0;

  if ( n == 1 )
  {
    return;
  }

  for ( i = 1; i < n; i++ )
  {
    v[i+1] = ( 
      ( ( c - 1.0 ) * x + ( 1.0 + c ) 
      * double( i ) + beta * c ) * v[i]
      - double( i ) * v[i-1] 
      ) / ( double( i ) + beta );
  }

  return;
}